

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *field)

{
  ModuleFieldType MVar1;
  pointer this_00;
  unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> local_70;
  unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> local_68;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_60;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_58;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_50;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_48;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_40;
  unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_38;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_30;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> local_28;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_20;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *local_18;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *field_local;
  Module *this_local;
  
  local_18 = field;
  field_local = (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)this;
  this_00 = std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::operator->
                      (field);
  MVar1 = ModuleField::type(this_00);
  switch(MVar1) {
  case Func:
    cast<wabt::FuncModuleField,wabt::ModuleField>((wabt *)&local_20,field);
    AppendField(this,&local_20);
    std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::~unique_ptr
              (&local_20);
    break;
  case Global:
    cast<wabt::GlobalModuleField,wabt::ModuleField>((wabt *)&local_28,field);
    AppendField(this,&local_28);
    std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
    ~unique_ptr(&local_28);
    break;
  case Import:
    cast<wabt::ImportModuleField,wabt::ModuleField>((wabt *)&local_30,field);
    AppendField(this,&local_30);
    std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
    ~unique_ptr(&local_30);
    break;
  case Export:
    cast<wabt::ExportModuleField,wabt::ModuleField>((wabt *)&local_38,field);
    AppendField(this,&local_38);
    std::unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>::
    ~unique_ptr(&local_38);
    break;
  case Type:
    cast<wabt::TypeModuleField,wabt::ModuleField>((wabt *)&local_40,field);
    AppendField(this,&local_40);
    std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
              (&local_40);
    break;
  case Table:
    cast<wabt::TableModuleField,wabt::ModuleField>((wabt *)&local_48,field);
    AppendField(this,&local_48);
    std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
    ~unique_ptr(&local_48);
    break;
  case ElemSegment:
    cast<wabt::ElemSegmentModuleField,wabt::ModuleField>((wabt *)&local_50,field);
    AppendField(this,&local_50);
    std::
    unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>::
    ~unique_ptr(&local_50);
    break;
  case Memory:
    cast<wabt::MemoryModuleField,wabt::ModuleField>((wabt *)&local_58,field);
    AppendField(this,&local_58);
    std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
    ~unique_ptr(&local_58);
    break;
  case DataSegment:
    cast<wabt::DataSegmentModuleField,wabt::ModuleField>((wabt *)&local_60,field);
    AppendField(this,&local_60);
    std::
    unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>::
    ~unique_ptr(&local_60);
    break;
  case Start:
    cast<wabt::StartModuleField,wabt::ModuleField>((wabt *)&local_68,field);
    AppendField(this,&local_68);
    std::unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>::
    ~unique_ptr(&local_68);
    break;
  case Tag:
    cast<wabt::TagModuleField,wabt::ModuleField>((wabt *)&local_70,field);
    AppendField(this,&local_70);
    std::unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>::~unique_ptr
              (&local_70);
  }
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<ModuleField> field) {
  switch (field->type()) {
    case ModuleFieldType::Func:
      AppendField(cast<FuncModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Global:
      AppendField(cast<GlobalModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Import:
      AppendField(cast<ImportModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Export:
      AppendField(cast<ExportModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Type:
      AppendField(cast<TypeModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Table:
      AppendField(cast<TableModuleField>(std::move(field)));
      break;

    case ModuleFieldType::ElemSegment:
      AppendField(cast<ElemSegmentModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Memory:
      AppendField(cast<MemoryModuleField>(std::move(field)));
      break;

    case ModuleFieldType::DataSegment:
      AppendField(cast<DataSegmentModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Start:
      AppendField(cast<StartModuleField>(std::move(field)));
      break;

    case ModuleFieldType::Tag:
      AppendField(cast<TagModuleField>(std::move(field)));
      break;
  }
}